

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cc
# Opt level: O2

void __thiscall
tchecker::par_expression_t::par_expression_t
          (par_expression_t *this,void **vtt,shared_ptr<const_tchecker::expression_t> *expr)

{
  void *pvVar1;
  invalid_argument *this_00;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x38)) = vtt[1];
  std::__shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_expr).
              super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>,
             &expr->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>);
  if ((this->_expr).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"nullptr sub expression");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

par_expression_t::par_expression_t(std::shared_ptr<tchecker::expression_t const> const & expr) : _expr(expr)
{
  if (_expr.get() == nullptr)
    throw std::invalid_argument("nullptr sub expression");
}